

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::
     class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_false,_(pybind11::return_value_policy)6>_>
     ::init_instance(instance *inst,void *holder_ptr)

{
  bool bVar1;
  type_info *find_type;
  type_index local_40;
  value_and_holder v_h;
  
  local_40._M_target =
       (type_info *)
       &detail::
        iterator_state<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,false,(pybind11::return_value_policy)6>
        ::typeinfo;
  find_type = detail::get_type_info(&local_40,false);
  detail::instance::get_value_and_holder(&v_h,inst,find_type,true);
  bVar1 = detail::value_and_holder::instance_registered(&v_h);
  if (!bVar1) {
    detail::register_instance(inst,*v_h.vh,v_h.type);
    detail::value_and_holder::set_instance_registered(&v_h,true);
  }
  init_holder(inst,&v_h,(holder_type *)holder_ptr,*v_h.vh);
  return;
}

Assistant:

static void init_instance(detail::instance *inst, const void *holder_ptr) {
        auto v_h = inst->get_value_and_holder(detail::get_type_info(typeid(type)));
        if (!v_h.instance_registered()) {
            register_instance(inst, v_h.value_ptr(), v_h.type);
            v_h.set_instance_registered();
        }
        init_holder(inst, v_h, (const holder_type *) holder_ptr, v_h.value_ptr<type>());
    }